

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::DitheringCase::iterate(DitheringCase *this)

{
  bool bVar1;
  int iVar2;
  CommandLine *pCVar3;
  float local_44;
  undefined1 local_30 [7];
  bool success_1;
  Vec4 quadColor;
  int numQuads;
  bool success;
  DitheringCase *this_local;
  
  if (this->m_patternType == PATTERNTYPE_GRADIENT) {
    quadColor.m_data[3]._3_1_ = drawAndCheckGradient(this,this->m_iteration == 1,&this->m_color);
    if (!(bool)quadColor.m_data[3]._3_1_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
      return STOP;
    }
    if (this->m_iteration == 1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  else if (this->m_patternType == PATTERNTYPE_UNICOLORED_QUAD) {
    pCVar3 = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
    iVar2 = tcu::CommandLine::getTestIterationCount(pCVar3);
    if (iVar2 < 1) {
      local_44 = 4.2039e-44;
    }
    else {
      pCVar3 = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
      local_44 = (float)tcu::CommandLine::getTestIterationCount(pCVar3);
    }
    quadColor.m_data[2] = local_44;
    tcu::operator*((tcu *)local_30,(float)this->m_iteration / (float)((int)local_44 + -1),
                   &this->m_color);
    bVar1 = drawAndCheckUnicoloredQuad(this,(Vec4 *)local_30);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
      return STOP;
    }
    if (this->m_iteration == (int)quadColor.m_data[2] + -1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  this->m_iteration = this->m_iteration + 1;
  return CONTINUE;
}

Assistant:

DitheringCase::IterateResult DitheringCase::iterate (void)
{
	if (m_patternType == PATTERNTYPE_GRADIENT)
	{
		// Draw horizontal and vertical gradients.

		DE_ASSERT(m_iteration < 2);

		const bool success = drawAndCheckGradient(m_iteration == 1, m_color);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else if (m_patternType == PATTERNTYPE_UNICOLORED_QUAD)
	{
		const int numQuads = m_testCtx.getCommandLine().getTestIterationCount() > 0 ? m_testCtx.getCommandLine().getTestIterationCount() : 30;

		DE_ASSERT(m_iteration < numQuads);

		const Vec4 quadColor	= (float)m_iteration / (float)(numQuads-1) * m_color;
		const bool success		=  drawAndCheckUnicoloredQuad(quadColor);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == numQuads - 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else
		DE_ASSERT(false);

	m_iteration++;

	return CONTINUE;
}